

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall BloatyTest::CheckCSVConsistency(BloatyTest *this,int row_count)

{
  pointer pcVar1;
  RollupOutput *pRVar2;
  bool bVar3;
  pointer pbVar4;
  internal iVar5;
  bool bVar6;
  bool bVar7;
  int base;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *p_Var8;
  undefined1 auVar9 [8];
  char *in_R9;
  pointer pbVar10;
  char *pcVar11;
  string_view text;
  string_view text_00;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cols;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rows;
  string csv_output;
  OutputOptions options;
  ostringstream stream;
  undefined1 local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_250;
  AssertHelper local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  AssertHelper local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  int local_1f4;
  BloatyTest *local_1f0;
  pointer local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined1 local_1d0 [32];
  undefined4 local_1b0;
  undefined1 local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f4 = row_count;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0._24_8_ = 0x50;
  local_1b0 = 2;
  local_1ac = 0;
  local_1d0._16_4_ = 1;
  local_1f0 = this;
  bloaty::RollupOutput::Print
            ((this->output_)._M_t.
             super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
             ._M_t.
             super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
             .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl,
             (OutputOptions *)(local_1d0 + 0x10),(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  local_270 = (undefined1  [8])local_1d8;
  local_268 = local_1e0;
  local_260._M_local_buf[0] = '\n';
  absl::strings_internal::
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::operator()(&local_210,
               (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)&local_230,
               (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_270);
  pcVar11 = anon_var_dwarf_40a25d + 0x11;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)local_270,"\"\"","rows[rows.size() - 1]",
             (char (*) [1])(anon_var_dwarf_40a25d + 0x11),
             local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = (local_268->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",0x72
               ,pcVar11);
    testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_230);
  }
  else {
    if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_268,local_268);
    }
    pbVar10 = local_210.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    pcVar1 = local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    pbVar4 = local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_210.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &pbVar4->field_2) {
      operator_delete(pcVar1,(pbVar4->field_2)._M_allocated_capacity + 1);
    }
    local_230.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)local_210.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_210.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_248.data_ = (AssertHelperData *)((ulong)local_248.data_._4_4_ << 0x20);
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_270,"rows.size()","0",(unsigned_long *)&local_230,(int *)&local_248
              );
    if (local_270[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_230);
      if (local_268 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_40a25d + 0x11;
      }
      else {
        pcVar11 = (local_268->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x75,pcVar11);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_230);
    }
    else {
      if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_268,local_268);
      }
      local_230.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((long)local_210.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_210.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_270,"rows.size() - 1","row_count",(unsigned_long *)&local_230,
                 &local_1f4);
      if (local_270[0] != (internal)0x0) {
        if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_268,local_268);
        }
        local_1e8 = local_210.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = true;
          pbVar10 = local_210.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (pbVar10->_M_dataplus)._M_p;
            local_270 = (undefined1  [8])pbVar10->_M_string_length;
            local_260._M_local_buf[0] = ',';
            absl::strings_internal::
            Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::
            ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::operator()(&local_230,
                         (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          *)&local_248,
                         (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)local_270);
            if (bVar7) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_248,
                       &((local_1f0->output_)._M_t.
                         super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                         .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->
                        source_names_);
              local_270 = (undefined1  [8])&local_260;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"vmsize","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270);
              if (local_270 != (undefined1  [8])&local_260) {
                operator_delete((void *)local_270,
                                CONCAT71(local_260._M_allocated_capacity._1_7_,
                                         local_260._M_local_buf[0]) + 1);
              }
              local_270 = (undefined1  [8])&local_260;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"filesize","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270);
              if (local_270 != (undefined1  [8])&local_260) {
                operator_delete((void *)local_270,
                                CONCAT71(local_260._M_allocated_capacity._1_7_,
                                         local_260._M_local_buf[0]) + 1);
              }
              testing::internal::
              CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((internal *)local_270,"cols","expected_headers",&local_230,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_248);
              iVar5 = local_270[0];
              if (local_270[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_250);
                pcVar11 = anon_var_dwarf_40a25d + 0x11;
                if (local_268 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = (local_268->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_218,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                           ,0x80,pcVar11);
                testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
                testing::internal::AssertHelper::~AssertHelper(&local_218);
                if (local_250._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_250._M_head_impl + 8))();
                }
              }
              if (local_268 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_268,local_268);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_248);
              bVar3 = true;
              if (iVar5 != (internal)0x0) {
                bVar7 = false;
                goto LAB_0017d221;
              }
            }
            else {
              pRVar2 = (local_1f0->output_)._M_t.
                       super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                       .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl;
              local_248.data_ =
                   (AssertHelperData *)
                   (((long)*(pointer *)
                            ((long)&(pRVar2->source_names_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&(pRVar2->source_names_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    >> 5) + 2);
              local_250._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_230.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_230.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
              p_Var8 = &local_250;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)local_270,"output_->source_names().size() + 2","cols.size()",
                         (unsigned_long *)&local_248,(unsigned_long *)&local_250);
              base = (int)p_Var8;
              if (local_270[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_248);
                pcVar11 = anon_var_dwarf_40a25d + 0x11;
                if (local_268 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = (local_268->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_250,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                           ,0x85,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_250,(Message *)&local_248);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_250);
                if (local_248.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_248.data_ + 8))();
                }
                if (local_268 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_268,local_268);
                }
                bVar3 = true;
              }
              else {
                if (local_268 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_268,local_268);
                }
                text._M_str = local_270;
                text._M_len = (size_t)local_230.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus.
                                      _M_p;
                bVar6 = absl::numbers_internal::safe_strto32_base
                                  ((numbers_internal *)
                                   local_230.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length,
                                   text,(Nonnull<int32_t_*>)0xa,base);
                local_248.data_._0_1_ = bVar6;
                local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                if (!bVar6) {
                  testing::Message::Message((Message *)&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_270,(internal *)&local_248,
                             (AssertionResult *)"absl::SimpleAtoi(cols[cols.size() - 1], &out)",
                             "false","true",in_R9);
                  auVar9 = local_270;
                  testing::internal::AssertHelper::AssertHelper
                            (&local_218,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                             ,0x86,(char *)local_270);
                  base = SUB84(auVar9,0);
                  testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_218);
                  if (local_270 != (undefined1  [8])&local_260) {
                    operator_delete((void *)local_270,
                                    CONCAT71(local_260._M_allocated_capacity._1_7_,
                                             local_260._M_local_buf[0]) + 1);
                  }
                  if (local_250._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_250._M_head_impl + 8))();
                  }
                  if (local_240[0] !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_240,local_240[0]);
                  }
                  bVar3 = true;
                  if (!bVar6) goto LAB_0017d293;
                }
                text_00._M_str = local_270;
                text_00._M_len =
                     (size_t)local_230.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-2]._M_dataplus._M_p;
                bVar6 = absl::numbers_internal::safe_strto32_base
                                  ((numbers_internal *)
                                   local_230.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-2]._M_string_length,
                                   text_00,(Nonnull<int32_t_*>)0xa,base);
                local_248.data_._0_1_ = bVar6;
                local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                if (!bVar6) {
                  testing::Message::Message((Message *)&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_270,(internal *)&local_248,
                             (AssertionResult *)"absl::SimpleAtoi(cols[cols.size() - 2], &out)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_218,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                             ,0x87,(char *)local_270);
                  testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_218);
                  if (local_270 != (undefined1  [8])&local_260) {
                    operator_delete((void *)local_270,
                                    CONCAT71(local_260._M_allocated_capacity._1_7_,
                                             local_260._M_local_buf[0]) + 1);
                  }
                  if (local_250._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_250._M_head_impl + 8))();
                  }
                  if (local_240[0] !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_240,local_240[0]);
                  }
                  bVar3 = true;
                  if (!bVar6) goto LAB_0017d293;
                }
LAB_0017d221:
                bVar3 = false;
              }
            }
LAB_0017d293:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_230);
          } while ((!bVar3) && (pbVar10 = pbVar10 + 1, pbVar10 != local_1e8));
        }
        goto LAB_0017d3ce;
      }
      testing::Message::Message((Message *)&local_230);
      if (local_268 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_40a25d + 0x11;
      }
      else {
        pcVar11 = (local_268->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x77,pcVar11);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_230);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_248);
  if (local_230.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_230.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
  }
  if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_268,local_268);
  }
LAB_0017d3ce:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0) {
    operator_delete(local_1e0,(ulong)(local_1d0._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CheckCSVConsistency(int row_count) {
    std::ostringstream stream;
    bloaty::OutputOptions options;
    options.output_format = bloaty::OutputFormat::kCSV;
    output_->Print(options, &stream);
    std::string csv_output = stream.str();

    std::vector<std::string> rows = absl::StrSplit(csv_output, '\n');
    // Output ends with a final '\n', trim this.
    ASSERT_EQ("", rows[rows.size() - 1]);
    rows.pop_back();

    ASSERT_GT(rows.size(), 0);  // There should be a header row.

    ASSERT_EQ(rows.size() - 1, row_count);
    bool first = true;
    for (const auto& row : rows) {
      std::vector<std::string> cols = absl::StrSplit(row, ',');
      if (first) {
        // header row should be: header1,header2,...,vmsize,filesize
        std::vector<std::string> expected_headers(output_->source_names());
        expected_headers.push_back("vmsize");
        expected_headers.push_back("filesize");
        ASSERT_EQ(cols, expected_headers);
        first = false;
      } else {
        // Final two columns should parse as integer.
        int out;
        ASSERT_EQ(output_->source_names().size() + 2, cols.size());
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 1], &out));
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 2], &out));
      }
    }
  }